

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.h
# Opt level: O2

Object * __thiscall GCPtr<symbols::Object>::operator=(GCPtr<symbols::Object> *this,Object *t)

{
  iterator iVar1;
  GCInfo<symbols::Object> gcObj;
  value_type local_20;
  
  iVar1 = findPtrInfo(this,this->addr);
  *(int *)&iVar1._M_node[1]._M_next = *(int *)&iVar1._M_node[1]._M_next + -1;
  iVar1 = findPtrInfo(this,t);
  if (iVar1._M_node == (_List_node_base *)&gclist_abi_cxx11_) {
    local_20.refcount = 1;
    local_20.memPtr = t;
    std::__cxx11::list<GCInfo<symbols::Object>,_std::allocator<GCInfo<symbols::Object>_>_>::
    push_front(&gclist_abi_cxx11_,&local_20);
  }
  else {
    *(int *)&iVar1._M_node[1]._M_next = *(int *)&iVar1._M_node[1]._M_next + 1;
  }
  this->addr = t;
  return t;
}

Assistant:

T * GCPtr<T>::operator=(T *t){

    typename list<GCInfo<T>>::iterator p;
    // First, decrement the reference count
    // for the memory currently being pointed to.
    p = findPtrInfo(addr);
    p->refcount--;
    // Next, if the new address is already
    // existent in the system, increment its
    // count. Otherwise, create a new entry
    // for gclist.
    p = findPtrInfo(t);
    if(p != gclist.end())
        p->refcount++;
    else {
        // Create and store this entry.
        GCInfo<T> gcObj(t);
        gclist.push_front(gcObj);
    }
    addr = t; // store the address.
    return t;
}